

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O2

intrusive_ptr<booster::callable<void_()>_> * __thiscall
booster::intrusive_ptr<booster::callable<void_()>_>::operator=
          (intrusive_ptr<booster::callable<void_()>_> *this,callable<void_()> *rhs)

{
  callable<void_()> *tmp;
  intrusive_ptr<booster::callable<void_()>_> local_18;
  
  if (rhs != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  local_18 = (intrusive_ptr<booster::callable<void_()>_>)this->p_;
  this->p_ = rhs;
  ~intrusive_ptr(&local_18);
  return this;
}

Assistant:

intrusive_ptr & operator=(T * rhs)
    {
        this_type(rhs).swap(*this);
        return *this;
    }